

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

u32string * anon_unknown.dwarf_ec6a::cpputf8_u8_to_u32(u32string *__return_storage_ptr__,string *u8)

{
  utf8 *this;
  back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  in_RCX;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  this = (utf8 *)(u8->_M_dataplus)._M_p;
  utf8::
  utf8to32<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::u32string>>
            (this,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )(this + u8->_M_string_length),
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

inline
u32string cpputf8_u8_to_u32(const string& u8)
{
    u32string u32;
    utf8::utf8to32(std::begin(u8), std::end(u8), std::back_inserter(u32));
    return u32;
}